

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall SMBusSimulationDataGenerator::OutputStop(SMBusSimulationDataGenerator *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar1 == 0) {
    iVar1 = SimulationChannelDescriptor::GetCurrentBitState();
    if (iVar1 == 1) {
      ClockGenerator::AdvanceByTimeS(8e-06);
      SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
      SimulationChannelDescriptor::Transition();
    }
    uVar2 = (int)this + 0x18;
    ClockGenerator::AdvanceByTimeS(8e-06);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByTimeS(8e-06);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
    SimulationChannelDescriptor::Transition();
    return;
  }
  __assert_fail("mSMBCLK->GetCurrentBitState() == BIT_LOW",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]smbus-analyzer/src/SMBusSimulationDataGenerator.cpp"
                ,0x7f,"void SMBusSimulationDataGenerator::OutputStop()");
}

Assistant:

void SMBusSimulationDataGenerator::OutputStop()
{
    // SMBCLK must be low
    assert( mSMBCLK->GetCurrentBitState() == BIT_LOW );

    // get SMBDAT low
    if( mSMBDAT->GetCurrentBitState() == BIT_HIGH )
    {
        AdvanceAllBySec( ONE_US * 8 ); // insert a pause before we start
        mSMBDAT->Transition();
    }

    // SMBCLK goes high
    AdvanceAllBySec( ONE_US * 8 );
    mSMBCLK->Transition();

    // SMBDAT goes high
    AdvanceAllBySec( ONE_US * 8 );
    mSMBDAT->Transition();
}